

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::testDepthStencilSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_X8_D24_UNORM_PACK32,0x200);
  if (!bVar1) {
    bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D32_SFLOAT,0x200);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "Doesn\'t support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT",
                 &local_31);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_30);
      goto LAB_00486d9d;
    }
  }
  bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D24_UNORM_S8_UINT,0x200);
  if (!bVar1) {
    bVar1 = optimalTilingFeaturesSupported(context,VK_FORMAT_D32_SFLOAT_S8_UINT,0x200);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "Doesn\'t support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT"
                 ,&local_31);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_30);
      goto LAB_00486d9d;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Required depth/stencil formats supported",&local_31);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_30);
LAB_00486d9d:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testDepthStencilSupported (Context& context)
{
	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_X8_D24_UNORM_PACK32, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_X8_D24_UNORM_PACK32 or VK_FORMAT_D32_SFLOAT");

	if (!optimalTilingFeaturesSupported(context, VK_FORMAT_D24_UNORM_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT) &&
		!optimalTilingFeaturesSupported(context, VK_FORMAT_D32_SFLOAT_S8_UINT, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
		return tcu::TestStatus::fail("Doesn't support one of VK_FORMAT_D24_UNORM_S8_UINT or VK_FORMAT_D32_SFLOAT_S8_UINT");

	return tcu::TestStatus::pass("Required depth/stencil formats supported");
}